

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest11::testDraw
          (FunctionalTest11 *this,GLuint *routine_configuration,GLuint *sampler_configuration,
          GLubyte *expected_color,texture *color_texture)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint i;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  pointer puVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> captured_data;
  GLuint subroutine_indices [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  GLubyte *local_68;
  texture *local_60;
  GLuint *local_58;
  GLuint *local_50;
  GLuint local_48 [6];
  
  local_68 = expected_color;
  local_60 = color_texture;
  local_58 = routine_configuration;
  local_50 = sampler_configuration;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  lVar9 = 0;
  bVar10 = true;
  do {
    bVar7 = bVar10;
    GVar1 = this->m_uniform_locations[lVar9];
    GVar2 = this->m_source_textures[local_50[lVar9]];
    (**(code **)(lVar8 + 8))((uint)lVar9 | 0x84c0);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"ActiveTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1698);
    (**(code **)(lVar8 + 0xb8))(0xde1,GVar2);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x169b);
    (**(code **)(lVar8 + 0x14f0))(GVar1,lVar9);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x169e);
    lVar9 = 1;
    bVar10 = false;
  } while (bVar7);
  (**(code **)(lVar8 + 8))(0x84c0);
  lVar9 = 0;
  do {
    local_48[this->m_subroutine_uniform_locations[lVar9]] =
         this->m_subroutine_indices[lVar9][local_58[lVar9]];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5);
  (**(code **)(lVar8 + 0x1668))(0x8b30,5,local_48);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x16ad);
  (**(code **)(lVar8 + 0x538))(0,0,1);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x16b1);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_88,0x1000);
  Utils::texture::get(local_60,0x1908,0x1401,
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  puVar5 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 3;
  uVar6 = 0;
  bVar10 = false;
  do {
    lVar8 = 0;
    do {
      if ((((*local_68 != puVar5[lVar8 * 4 + -3]) || (local_68[1] != puVar5[lVar8 * 4 + -2])) ||
          (local_68[2] != puVar5[lVar8 * 4 + -1])) || (local_68[3] != puVar5[lVar8 * 4]))
      goto LAB_0097d28b;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x20);
    bVar10 = 0x1e < uVar6;
    uVar6 = uVar6 + 1;
    puVar5 = puVar5 + 0x80;
  } while (uVar6 != 0x20);
  bVar10 = true;
LAB_0097d28b:
  operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return bVar10;
}

Assistant:

bool FunctionalTest11::testDraw(const glw::GLuint routine_configuration[5], const glw::GLuint sampler_configuration[2],
								const glw::GLubyte expected_color[4], Utils::texture& color_texture) const
{
	const glw::Functions& gl					= m_context.getRenderContext().getFunctions();
	static const GLint	n_samplers			= 2;
	static const GLint	n_subroutine_uniforms = 5;
	GLuint				  subroutine_indices[5];

	/* Set samplers */
	for (GLuint i = 0; i < n_samplers; ++i)
	{
		const GLuint location = m_uniform_locations[i];
		const GLuint texture  = m_source_textures[sampler_configuration[i]];

		gl.activeTexture(GL_TEXTURE0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

		gl.bindTexture(GL_TEXTURE_2D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.uniform1i(location, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");
	}

	gl.activeTexture(GL_TEXTURE0 + 0);

	/* Set subroutine uniforms */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];
		const GLuint routine  = routine_configuration[i];

		subroutine_indices[location] = m_subroutine_indices[i][routine];
	}

	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 5, subroutine_indices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Capture result */
	std::vector<GLubyte> captured_data;
	captured_data.resize(m_texture_width * m_texture_height * 4);

	color_texture.get(GL_RGBA, GL_UNSIGNED_BYTE, &captured_data[0]);

	/* Verify result */
	for (GLuint y = 0; y < m_texture_height; ++y)
	{
		const GLuint line_offset = y * m_texture_width * 4;

		for (GLuint x = 0; x < m_texture_width; ++x)
		{
			const GLuint point_offset   = x * 4 + line_offset;
			bool		 is_as_expected = true;

			is_as_expected = is_as_expected && (expected_color[0] == captured_data[point_offset + 0]); /* red */
			is_as_expected = is_as_expected && (expected_color[1] == captured_data[point_offset + 1]); /* green */
			is_as_expected = is_as_expected && (expected_color[2] == captured_data[point_offset + 2]); /* blue */
			is_as_expected = is_as_expected && (expected_color[3] == captured_data[point_offset + 3]); /* alpha */

			if (false == is_as_expected)
			{
				return false;
			}
		}
	}

	/* Done */
	return true;
}